

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O2

int Abc_RecToGia3(Gia_Man_t *pMan,If_Man_t *pIfMan,If_Cut_t *pCut,Vec_Int_t *vLeaves,int fHash)

{
  byte bVar1;
  Gia_Man_t *p;
  Lms_Man_t *pLVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint Lit;
  word *t;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Gia_Obj_t *pObj;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int BestPo;
  uint uCanonPhase;
  char pCanonPerm [16];
  int local_68;
  uint local_64;
  Gia_Obj_t *local_60;
  If_Cut_t *local_58;
  ulong local_50;
  char local_48 [24];
  
  pLVar2 = s_pMan3;
  p = s_pMan3->pGia;
  local_68 = -1;
  if (pIfMan->pPars->fCutMin != 1) {
    __assert_fail("pIfMan->pPars->fCutMin == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x45a,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  bVar1 = pCut->field_0x1f;
  uVar9 = (ulong)bVar1;
  if ((uint)bVar1 != vLeaves->nSize) {
    __assert_fail("nLeaves == Vec_IntSize(vLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                  ,0x45b,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)")
    ;
  }
  t = If_CutTruthW(pIfMan,pCut);
  uVar3 = Abc_TtSupport(t,(uint)bVar1);
  if (uVar3 == 0) {
    iVar4 = If_CutTruthIsCompl(pCut);
    return iVar4;
  }
  iVar4 = Abc_TtSuppIsMinBase(uVar3);
  if ((uVar3 != 1) && (iVar4 != 0)) {
    uVar3 = Gia_WordCountOnes(uVar3);
    if (uVar3 != bVar1) {
      __assert_fail("Gia_WordCountOnes(uSupport) == nLeaves",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x466,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    If_CutFindBestStruct(pIfMan,pCut,local_48,&local_64,&local_68);
    if (local_68 < 0) {
      __assert_fail("BestPo >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x46a,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    pGVar7 = Gia_ManCo(p,local_68);
    if (p->vTtNodes == (Vec_Int_t *)0x0) {
      pVVar8 = Vec_IntAlloc(0x100);
      p->vTtNodes = pVVar8;
    }
    if (((int)(uint)*(undefined8 *)(pGVar7 + -(*(ulong *)pGVar7 & 0x1fffffff)) < 0) ||
       (((uint)*(undefined8 *)(pGVar7 + -(*(ulong *)pGVar7 & 0x1fffffff)) & 0x1fffffff) ==
        0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x470,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    Gia_ObjCollectInternal(p,pGVar7 + -(*(ulong *)pGVar7 & 0x1fffffff));
    if (p->vTtNodes->nSize < 1) {
      __assert_fail("Vec_IntSize(pGia->vTtNodes) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                    ,0x472,
                    "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
    }
    pLVar2->vLabels->nSize = 0;
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      pVVar8 = pLVar2->vLabels;
      iVar4 = Vec_IntEntry(vLeaves,(int)local_48[uVar11]);
      iVar4 = Abc_LitNotCond(iVar4,(uint)((local_64 >> ((uint)uVar11 & 0x1f) & 1) != 0));
      Vec_IntPush(pVVar8,iVar4);
    }
    pObj = (Gia_Obj_t *)0x0;
    iVar4 = 0;
    local_60 = pGVar7;
    local_58 = pCut;
    local_50 = uVar9;
    do {
      iVar6 = (int)uVar9;
      if (p->vTtNodes->nSize <= iVar4) {
        if ((-1 < (int)(uint)*(undefined8 *)pObj) &&
           (((uint)*(undefined8 *)pObj & 0x1fffffff) != 0x1fffffff)) {
          pVVar8 = pLVar2->vLabels;
          iVar4 = Gia_ObjNum(p,pObj);
          iVar4 = Vec_IntEntry(pVVar8,iVar4 + iVar6);
          iVar4 = Abc_LitNotCond(iVar4,(*(uint *)&local_58->field_0x1c >> 0xc ^
                                       local_64 >> ((byte)uVar9 & 0x1f) ^ *(uint *)local_60 >> 0x1d)
                                       & 1);
          return iVar4;
        }
        __assert_fail("Gia_ObjIsAnd(pGiaTemp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x48e,
                      "int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
      }
      iVar5 = Vec_IntEntry(p->vTtNodes,iVar4);
      pObj = Gia_ManObj(p,iVar5);
      uVar11 = *(ulong *)pObj;
      *(ulong *)pObj = uVar11 & 0xffffffffbfffffff;
      uVar11 = (ulong)((uint)uVar11 & 0x1fffffff);
      pVVar8 = pLVar2->vLabels;
      if ((~*(uint *)(pObj + -uVar11) & 0x1fffffff) == 0 || (int)*(uint *)(pObj + -uVar11) < 0) {
        iVar5 = Gia_ObjCioId(pObj + -uVar11);
      }
      else {
        iVar5 = Gia_ObjNum(p,pObj + -uVar11);
        iVar5 = iVar5 + iVar6;
      }
      iVar5 = Vec_IntEntry(pVVar8,iVar5);
      uVar3 = Abc_LitNotCond(iVar5,*(uint *)pObj >> 0x1d & 1);
      uVar11 = (ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
      pVVar8 = pLVar2->vLabels;
      if ((~*(uint *)(pObj + -uVar11) & 0x1fffffff) == 0 || (int)*(uint *)(pObj + -uVar11) < 0) {
        iVar5 = Gia_ObjCioId(pObj + -uVar11);
      }
      else {
        iVar5 = Gia_ObjNum(p,pObj + -uVar11);
        iVar5 = iVar5 + iVar6;
      }
      iVar6 = Vec_IntEntry(pVVar8,iVar5);
      Lit = Abc_LitNotCond(iVar6,(uint)((ulong)*(undefined8 *)pObj >> 0x3d) & 1);
      if (fHash == 0) {
        pGVar7 = Gia_ManAppendObj(pMan);
        iVar6 = Abc_Lit2Var(uVar3);
        if (pMan->nObjs <= iVar6) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x267,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar6 = Abc_Lit2Var(Lit);
        if (pMan->nObjs <= iVar6) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar6 = Abc_Lit2Var(uVar3);
        iVar5 = Abc_Lit2Var(Lit);
        if (iVar6 == iVar5) {
          __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x269,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        iVar6 = Gia_ObjId(pMan,pGVar7);
        iVar5 = Abc_Lit2Var(uVar3);
        uVar9 = (ulong)(iVar6 - iVar5 & 0x1fffffff);
        if (uVar3 < Lit) {
          *(ulong *)pGVar7 =
               (ulong)((uVar3 & 1) << 0x1d) | *(ulong *)pGVar7 & 0xffffffffc0000000 | uVar9;
          iVar6 = Gia_ObjId(pMan,pGVar7);
          iVar5 = Abc_Lit2Var(Lit);
          uVar12 = (ulong)(iVar6 - iVar5 & 0x1fffffff) << 0x20;
          uVar9 = *(ulong *)pGVar7 & 0xc0000000ffffffff;
          uVar11 = (ulong)(Lit & 1) << 0x3d;
        }
        else {
          *(ulong *)pGVar7 =
               (ulong)(uVar3 & 1) << 0x3d | *(ulong *)pGVar7 & 0xc0000000ffffffff | uVar9 << 0x20;
          iVar6 = Gia_ObjId(pMan,pGVar7);
          iVar5 = Abc_Lit2Var(Lit);
          uVar12 = (ulong)(iVar6 - iVar5 & 0x1fffffff);
          uVar9 = *(ulong *)pGVar7 & 0xffffffffc0000000;
          uVar11 = (ulong)((Lit & 1) << 0x1d);
        }
        uVar12 = uVar11 | uVar9 | uVar12;
        *(ulong *)pGVar7 = uVar12;
        if (pMan->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(pMan,pGVar7 + -(uVar12 & 0x1fffffff),pGVar7);
          Gia_ObjAddFanout(pMan,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff),pGVar7);
        }
        if (pMan->fSweeper != 0) {
          uVar11 = *(ulong *)pGVar7 & 0x1fffffff;
          uVar9 = *(ulong *)pGVar7 >> 0x20 & 0x1fffffff;
          uVar12 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar7 + -uVar11) >> 0x1e & 1) == 0) {
            uVar12 = 0x40000000;
          }
          *(ulong *)(pGVar7 + -uVar11) = uVar12 | *(ulong *)(pGVar7 + -uVar11);
          uVar12 = *(ulong *)(pGVar7 + -uVar9);
          uVar10 = 0x4000000000000000;
          if (((uint)uVar12 >> 0x1e & 1) == 0) {
            uVar10 = 0x40000000;
          }
          *(ulong *)(pGVar7 + -uVar9) = uVar10 | uVar12;
          uVar9 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 =
               uVar9 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar9 >> 0x3d) ^ (uint)(uVar12 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar7 + -uVar11) >> 0x3f) ^
                      (uint)(uVar9 >> 0x1d) & 7)) << 0x3f;
        }
        iVar6 = Gia_ObjId(pMan,pGVar7);
        iVar6 = iVar6 * 2;
        uVar9 = local_50;
      }
      else {
        iVar6 = Gia_ManHashAnd(pMan,uVar3,Lit);
      }
      Vec_IntPush(pLVar2->vLabels,iVar6);
      iVar4 = iVar4 + 1;
    } while( true );
  }
  if ((uVar3 & uVar3 - 1) == 0) {
    iVar4 = Abc_TtSuppFindFirst(uVar3);
    iVar4 = Vec_IntEntry(vLeaves,iVar4);
    iVar6 = If_CutTruthIsCompl(pCut);
    iVar4 = Abc_LitNotCond(iVar4,iVar6);
    return iVar4;
  }
  __assert_fail("Abc_TtSuppOnlyOne(uSupport)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                ,0x463,"int Abc_RecToGia3(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, int)");
}

Assistant:

int Abc_RecToGia3( Gia_Man_t * pMan, If_Man_t * pIfMan, If_Cut_t * pCut, Vec_Int_t * vLeaves, int fHash )
{
    Lms_Man_t * p = s_pMan3;
    char pCanonPerm[LMS_VAR_MAX];
    unsigned uCanonPhase;
    int iFan0, iFan1, iGiaObj;
    Gia_Man_t * pGia = p->pGia;
    Gia_Obj_t * pGiaPo, * pGiaTemp = NULL;
    int i, uSupport, BestPo = -1, nLeaves = If_CutLeaveNum(pCut);
    assert( pIfMan->pPars->fCutMin == 1 );
    assert( nLeaves == Vec_IntSize(vLeaves) );

    // compute support
    uSupport = Abc_TtSupport( If_CutTruthW(pIfMan, pCut), nLeaves );
    if ( uSupport == 0 )
        return Abc_LitNotCond( 0, If_CutTruthIsCompl(pCut) );
    if ( !Abc_TtSuppIsMinBase(uSupport) || uSupport == 1 )
    {
        assert( Abc_TtSuppOnlyOne(uSupport) );
        return Abc_LitNotCond( Vec_IntEntry(vLeaves, Abc_TtSuppFindFirst(uSupport)), If_CutTruthIsCompl(pCut) );
    }
    assert( Gia_WordCountOnes(uSupport) == nLeaves );

    // get the best output for this node
    If_CutFindBestStruct( pIfMan, pCut, pCanonPerm, &uCanonPhase, &BestPo );
    assert( BestPo >= 0 );
    pGiaPo = Gia_ManCo( pGia, BestPo );

    // collect internal nodes into pGia->vTtNodes
    if ( pGia->vTtNodes == NULL )
        pGia->vTtNodes = Vec_IntAlloc( 256 );
    assert( Gia_ObjIsAnd( Gia_ObjFanin0(pGiaPo) ) );
    Gia_ObjCollectInternal( pGia, Gia_ObjFanin0(pGiaPo) );
    assert( Vec_IntSize(pGia->vTtNodes) > 0 );

    // collect GIA nodes for leaves
    Vec_IntClear( p->vLabels );
    for (i = 0; i < nLeaves; i++)
        Vec_IntPush( p->vLabels, Abc_LitNotCond(Vec_IntEntry(vLeaves, pCanonPerm[i]), (uCanonPhase >> i) & 1) );

    // compute HOP nodes for internal nodes
    Gia_ManForEachObjVec( pGia->vTtNodes, pGia, pGiaTemp, i )
    {
        pGiaTemp->fMark0 = 0; // unmark node marked by Gia_ObjCollectInternal()
        if ( Gia_ObjIsAnd(Gia_ObjFanin0(pGiaTemp)) )
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin0(pGiaTemp)) + nLeaves);
        else
            iFan0 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin0(pGiaTemp)));
        iFan0 = Abc_LitNotCond(iFan0, Gia_ObjFaninC0(pGiaTemp));
        if ( Gia_ObjIsAnd(Gia_ObjFanin1(pGiaTemp)) )
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, Gia_ObjFanin1(pGiaTemp)) + nLeaves);
        else
            iFan1 = Vec_IntEntry(p->vLabels, Gia_ObjCioId(Gia_ObjFanin1(pGiaTemp)));
        iFan1 = Abc_LitNotCond(iFan1, Gia_ObjFaninC1(pGiaTemp));
        if ( fHash )
            iGiaObj = Gia_ManHashAnd(pMan, iFan0, iFan1);
        else
            iGiaObj = Gia_ManAppendAnd(pMan, iFan0, iFan1);
        Vec_IntPush(p->vLabels, iGiaObj);
    }
    // get the final result
    assert( Gia_ObjIsAnd(pGiaTemp) );
    iGiaObj = Vec_IntEntry(p->vLabels, Gia_ObjNum(pGia, pGiaTemp) + nLeaves);
    // complement the result if needed
    return Abc_LitNotCond( iGiaObj,  Gia_ObjFaninC0(pGiaPo) ^ ((uCanonPhase >> nLeaves) & 1) ^ pCut->fCompl );    
}